

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapValues.cpp
# Opt level: O2

void TTD::NSSnapValues::InflateSnapPrimitiveValue
               (SnapPrimitiveValue *snapValue,InflateMap *inflator)

{
  JavascriptLibrary *this;
  TTD_PTR_ID objid;
  ScriptContext *scriptContext;
  JavascriptString *aValue;
  RecyclableObject *value;
  
  scriptContext = InflateMap::LookupScriptContext(inflator,snapValue->SnapType->ScriptContextLogId);
  if (snapValue->OptWellKnownToken == (TTD_WELLKNOWN_TOKEN)0x0) {
    this = (scriptContext->super_ScriptContextBase).javascriptLibrary;
    aValue = (JavascriptString *)
             InflateMap::FindReusableObjectIfExists(inflator,snapValue->PrimitiveValueId);
    if (aValue == (JavascriptString *)0x0) {
      switch(snapValue->SnapType->JsTypeId) {
      case TypeIds_Undefined:
        aValue = (JavascriptString *)(this->super_JavascriptLibraryBase).undefinedValue.ptr;
        break;
      case TypeIds_Null:
        aValue = (JavascriptString *)(this->super_JavascriptLibraryBase).nullValue.ptr;
        break;
      case TypeIds_Boolean:
        if ((snapValue->field_3).u_boolValue == 0) {
          aValue = (JavascriptString *)(this->super_JavascriptLibraryBase).booleanFalse.ptr;
        }
        else {
          aValue = (JavascriptString *)(this->super_JavascriptLibraryBase).booleanTrue.ptr;
        }
        break;
      default:
        TTDAbort_unrecoverable_error
                  ("These are supposed to be primitive values e.g., no pointers or properties.");
      case TypeIds_Number:
        aValue = (JavascriptString *)
                 Js::JavascriptNumber::ToVarWithCheck
                           ((snapValue->field_3).u_doubleValue,scriptContext);
        break;
      case TypeIds_Int64Number:
        aValue = (JavascriptString *)
                 Js::JavascriptTypedNumber<long>::ToVar
                           ((snapValue->field_3).u_int64Value,scriptContext);
        break;
      case TypeIds_LastNumberType:
        aValue = (JavascriptString *)
                 Js::JavascriptTypedNumber<unsigned_long>::ToVar
                           ((snapValue->field_3).u_uint64Value,scriptContext);
        break;
      case TypeIds_String:
        aValue = Js::JavascriptString::NewCopyBuffer
                           (((snapValue->field_3).u_stringValue)->Contents,
                            ((snapValue->field_3).u_stringValue)->Length,scriptContext);
        break;
      case TypeIds_Symbol:
        aValue = (JavascriptString *)
                 Js::JavascriptLibrary::CreatePrimitveSymbol_TTD
                           (this,(snapValue->field_3).u_propertyIdValue);
      }
    }
  }
  else {
    aValue = (JavascriptString *)
             RuntimeContextInfo::LookupKnownObjectFromPath
                       (scriptContext->TTDWellKnownInfo,snapValue->OptWellKnownToken);
  }
  objid = snapValue->PrimitiveValueId;
  value = Js::VarTo<Js::RecyclableObject>(aValue);
  InflateMap::AddObject(inflator,objid,value);
  return;
}

Assistant:

void InflateSnapPrimitiveValue(const SnapPrimitiveValue* snapValue, InflateMap* inflator)
        {
            Js::ScriptContext* ctx = inflator->LookupScriptContext(snapValue->SnapType->ScriptContextLogId);
            Js::JavascriptLibrary* jslib = ctx->GetLibrary();

            Js::Var res = nullptr;
            if(snapValue->OptWellKnownToken != TTD_INVALID_WELLKNOWN_TOKEN)
            {
                res = ctx->TTDWellKnownInfo->LookupKnownObjectFromPath(snapValue->OptWellKnownToken);
            }
            else
            {
                Js::RecyclableObject* rObj = inflator->FindReusableObjectIfExists(snapValue->PrimitiveValueId);
                if(rObj != nullptr)
                {
                    res = rObj;
                }
                else
                {
                    switch(snapValue->SnapType->JsTypeId)
                    {
                    case Js::TypeIds_Undefined:
                        res = jslib->GetUndefined();
                        break;
                    case Js::TypeIds_Null:
                        res = jslib->GetNull();
                        break;
                    case Js::TypeIds_Boolean:
                        res = (snapValue->u_boolValue ? jslib->GetTrue() : jslib->GetFalse());
                        break;
                    case Js::TypeIds_Number:
                        res = Js::JavascriptNumber::ToVarWithCheck(snapValue->u_doubleValue, ctx);
                        break;
                    case Js::TypeIds_Int64Number:
                        res = Js::JavascriptInt64Number::ToVar(snapValue->u_int64Value, ctx);
                        break;
                    case Js::TypeIds_UInt64Number:
                        res = Js::JavascriptUInt64Number::ToVar(snapValue->u_uint64Value, ctx);
                        break;
                    case Js::TypeIds_String:
                        res = Js::JavascriptString::NewCopyBuffer(snapValue->u_stringValue->Contents, snapValue->u_stringValue->Length, ctx);
                        break;
                    case Js::TypeIds_Symbol:
                        res = jslib->CreatePrimitveSymbol_TTD(snapValue->u_propertyIdValue);
                        break;
                    default:
                        TTDAssert(false, "These are supposed to be primitive values e.g., no pointers or properties.");
                        res = nullptr;
                    }
                }
            }

            inflator->AddObject(snapValue->PrimitiveValueId, Js::VarTo<Js::RecyclableObject>(res));
        }